

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O0

callback_t *
begin_property_state
          (callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  initializer_list<char> __l;
  bool bVar1;
  element_type *peVar2;
  QLoggingCategory *pQVar3;
  char *pcVar4;
  QDebug *pQVar5;
  QMessageLogger local_110;
  QDebug local_f0 [12];
  bool local_e4;
  allocator_type local_e3;
  char local_e2 [2];
  bool qt_category_enabled_1;
  iterator pcStack_e0;
  size_type local_d8;
  vector<char,_std::allocator<char>_> local_d0;
  string local_b8;
  QMessageLogger local_98;
  QDebug local_78 [15];
  bool local_69;
  undefined1 local_68 [7];
  bool qt_category_enabled;
  undefined1 local_48 [8];
  string property_name;
  int *error_local;
  ifstream *f_local;
  MetaConfiguration *conf_local;
  
  property_name.field_2._8_8_ = error;
  std::__cxx11::string::string((string *)local_48);
  clear_empty(f);
  anon_unknown.dwarf_1cea4::trim((string *)(anonymous_namespace)::global_string_abi_cxx11_);
  std::make_shared<MetaProperty>();
  std::shared_ptr<MetaProperty>::operator=
            ((shared_ptr<MetaProperty> *)(anonymous_namespace)::current_property,
             (shared_ptr<MetaProperty> *)local_68);
  std::shared_ptr<MetaProperty>::~shared_ptr((shared_ptr<MetaProperty> *)local_68);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (anonymous_namespace)::global_string_abi_cxx11_,"enum");
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(anonymous_namespace)::current_property);
    peVar2->is_enum = true;
    std::operator>>((istream *)f,(string *)(anonymous_namespace)::global_string_abi_cxx11_);
    pQVar3 = parser();
    local_69 = QLoggingCategory::isDebugEnabled(pQVar3);
    while (local_69 != false) {
      pQVar3 = parser();
      pcVar4 = QLoggingCategory::categoryName(pQVar3);
      QMessageLogger::QMessageLogger(&local_98,(char *)0x0,0,(char *)0x0,pcVar4);
      QMessageLogger::debug();
      pQVar5 = QDebug::operator<<(local_78,"Enum with type");
      operator<<(pQVar5,(string *)(anonymous_namespace)::global_string_abi_cxx11_);
      QDebug::~QDebug(local_78);
      local_69 = false;
    }
  }
  peVar2 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )(anonymous_namespace)::current_property);
  std::__cxx11::string::operator=
            ((string *)&peVar2->type,(string *)(anonymous_namespace)::global_string_abi_cxx11_);
  peVar2 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )(anonymous_namespace)::current_property);
  std::shared_ptr<MetaClass>::operator=
            (&peVar2->parent,(shared_ptr<MetaClass> *)(anonymous_namespace)::current_class);
  std::__cxx11::string::clear();
  local_e2[0] = '=';
  local_e2[1] = 10;
  pcStack_e0 = local_e2;
  local_d8 = 2;
  std::allocator<char>::allocator();
  __l._M_len = local_d8;
  __l._M_array = pcStack_e0;
  std::vector<char,_std::allocator<char>_>::vector(&local_d0,__l,&local_e3);
  read_untill_delimiters_abi_cxx11_(&local_b8,f,&local_d0);
  std::__cxx11::string::operator=((string *)local_48,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::vector<char,_std::allocator<char>_>::~vector(&local_d0);
  std::allocator<char>::~allocator(&local_e3);
  anon_unknown.dwarf_1cea4::trim((string *)local_48);
  peVar2 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )(anonymous_namespace)::current_property);
  std::__cxx11::string::operator=((string *)&peVar2->name,(string *)local_48);
  pQVar3 = parser();
  local_e4 = QLoggingCategory::isDebugEnabled(pQVar3);
  while (local_e4 != false) {
    pQVar3 = parser();
    pcVar4 = QLoggingCategory::categoryName(pQVar3);
    QMessageLogger::QMessageLogger(&local_110,(char *)0x0,0,(char *)0x0,pcVar4);
    QMessageLogger::debug();
    pQVar5 = QDebug::operator<<(local_f0,"Starting property ");
    pQVar5 = operator<<(pQVar5,(string *)local_48);
    QDebug::operator<<(pQVar5," ");
    QDebug::~QDebug(local_f0);
    local_e4 = false;
  }
  std::
  function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
  ::
  function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
            ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
              *)__return_storage_ptr__,property_state);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

callback_t begin_property_state(MetaConfiguration &conf, std::ifstream &f,
                                int &error) {
  // here we know that we have at least the type of the property,
  // but it can be three kinds of string.

  std::string property_name;
  clear_empty(f);

  trim(global_string);
  current_property = std::make_shared<MetaProperty>();

  if (global_string == "enum") {
    current_property->is_enum = true;
    f >> global_string;
    qCDebug(parser) << "Enum with type" << global_string;
  }

  current_property->type = global_string;
  current_property->parent = current_class;
  global_string.clear();

  // find the name of the property
  property_name = read_untill_delimiters(f, {'=', '\n'});
  trim(property_name);
  current_property->name = property_name;
  qCDebug(parser) << "Starting property " << property_name << " ";
  return property_state;
}